

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDevice.cpp
# Opt level: O2

bool __thiscall BlockDevice::ReadIdentifyData(BlockDevice *this,HANDLE h_,IDENTIFYDEVICE *identify_)

{
  int iVar1;
  
  iVar1 = ioctl((this->super_HDD).h,0x30d,&ReadIdentifyData::hd);
  if (iVar1 == 0) {
    identify_->len = 0x200;
    memcpy(&identify_->field_1,&ReadIdentifyData::hd,0x200);
  }
  return false;
}

Assistant:

bool BlockDevice::ReadIdentifyData(HANDLE h_, IDENTIFYDEVICE& identify_)
{
#ifdef _WIN32
    DWORD dwRet = 0;

    // Input is the identify command (0xEC)
    DWORD dwInSize = sizeof(SENDCMDINPARAMS) - 1;
    MEMORY memIn(dwInSize);
    SENDCMDINPARAMS* pIn = reinterpret_cast<SENDCMDINPARAMS*>(memIn.pb);
    pIn->irDriveRegs.bCommandReg = ID_CMD;

    // Output is a buffer for the identify data
    DWORD dwOutSize = sizeof(SENDCMDOUTPARAMS) + IDENTIFY_BUFFER_SIZE - 1;
    MEMORY memOut(dwOutSize);
    SENDCMDOUTPARAMS* pOut = reinterpret_cast<SENDCMDOUTPARAMS*>(memOut.pb);
    pOut->cBufferSize = IDENTIFY_BUFFER_SIZE;

    // Read the identify data buffer, and copy to the caller's buffer
    if (DeviceIoControl(h_, SMART_RCV_DRIVE_DATA, pIn, dwInSize, pOut, dwOutSize, &dwRet, nullptr))
    {
        memset(&identify_, 0, sizeof(identify_));

        identify_.len = std::min(dwRet, static_cast<DWORD>(sizeof(identify_.byte)));
        memcpy(&identify_.byte, pOut->bBuffer, identify_.len);

        return true;
    }
#else
    (void)h_;
#endif // WIN32

#ifdef HAVE_LINUX_HDREG_H
    static struct hd_driveid hd;

    // ATA query
    if (!ioctl(h, HDIO_GET_IDENTITY, &hd))
    {
        identify_.len = std::min(sizeof(hd), sizeof(identify_.byte));
        memcpy(&identify_.byte, &hd, identify_.len);
    }
#else
    (void)identify_;
#endif

    return false;
}